

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O2

DWARFUnit * __thiscall
llvm::DWARFDebugLine::SectionParser::prepareToParse(SectionParser *this,uint64_t Offset)

{
  iterator iVar1;
  DWARFUnit *pDVar2;
  DWARFDataExtractor *pDVar3;
  uint8_t uVar4;
  uint64_t local_18;
  uint64_t Offset_local;
  
  local_18 = Offset;
  iVar1 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_llvm::DWARFUnit_*>,_std::_Select1st<std::pair<const_unsigned_long,_llvm::DWARFUnit_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFUnit_*>_>_>
          ::find((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_llvm::DWARFUnit_*>,_std::_Select1st<std::pair<const_unsigned_long,_llvm::DWARFUnit_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFUnit_*>_>_>
                  *)this,&local_18);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->LineToUnit)._M_t._M_impl.super__Rb_tree_header) {
    pDVar3 = this->DebugLineData;
  }
  else {
    pDVar2 = (DWARFUnit *)iVar1._M_node[1]._M_parent;
    pDVar3 = this->DebugLineData;
    if (pDVar2 != (DWARFUnit *)0x0) {
      uVar4 = (pDVar2->Header).FormParams.AddrSize;
      goto LAB_00b3540b;
    }
  }
  pDVar2 = (DWARFUnit *)0x0;
  uVar4 = '\0';
LAB_00b3540b:
  (pDVar3->super_DataExtractor).AddressSize = uVar4;
  return pDVar2;
}

Assistant:

DWARFUnit *DWARFDebugLine::SectionParser::prepareToParse(uint64_t Offset) {
  DWARFUnit *U = nullptr;
  auto It = LineToUnit.find(Offset);
  if (It != LineToUnit.end())
    U = It->second;
  DebugLineData.setAddressSize(U ? U->getAddressByteSize() : 0);
  return U;
}